

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  _Alloc_hider _Var4;
  SystemInformationImplementation *pSVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  ulonglong uVar10;
  long *plVar11;
  long *plVar12;
  char cVar13;
  undefined8 *puVar14;
  char *__nptr;
  uint uVar15;
  bool bVar16;
  float fVar17;
  undefined1 *puStack_3d0;
  long lStack_3c8;
  undefined1 uStack_3c0;
  undefined7 uStack_3bf;
  string sStack_3b0;
  string sStack_390;
  SystemInformationImplementation *pSStack_370;
  string sStack_368;
  string sStack_348;
  undefined8 *puStack_328;
  undefined8 *puStack_320;
  long lStack_318;
  string sStack_308;
  FILE *pFStack_2e8;
  string sStack_2e0;
  string sStack_2c0;
  string sStack_2a0;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  string sStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a0;
  long *plStack_80;
  long lStack_78;
  long lStack_70;
  long lStack_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_3d0 = &uStack_3c0;
  lStack_3c8 = 0;
  uStack_3c0 = 0;
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Problem opening /proc/cpuinfo",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    goto LAB_0059bdfb;
  }
  iVar7 = feof(__stream);
  cVar13 = -2;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&puStack_3d0);
      iVar7 = feof(__stream);
      cVar13 = cVar13 + '\x01';
    } while (iVar7 == 0);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_3d0,cVar13);
  lVar9 = std::__cxx11::string::find((char *)&puStack_3d0,0x7b264b,0);
  if (lVar9 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar9 = std::__cxx11::string::find((char *)&puStack_3d0,0x7b264b,lVar9 + 1);
    } while (lVar9 != -1);
  }
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_60._M_impl.super__Rb_tree_header._M_header;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_e0,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_c0,this,&sStack_e0,"physical id",0);
  pFStack_2e8 = __stream;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
    operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
  }
  pSStack_370 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      sStack_348._M_dataplus._M_p._0_4_ = atoi(sStack_c0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &_Stack_60,(int *)&sStack_348);
      sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_100,puStack_3d0,puStack_3d0 + lStack_3c8);
      ExtractValueFromCpuInfoFile
                (&sStack_308,pSStack_370,&sStack_100,"physical id",
                 pSStack_370->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&sStack_c0,(string *)&sStack_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
        operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
        operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
      }
    } while (pSStack_370->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar16 = _Stack_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar7 = (int)_Stack_60._M_impl.super__Rb_tree_header._M_node_count;
  sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_120,puStack_3d0,puStack_3d0 + lStack_3c8);
  pSVar5 = pSStack_370;
  ExtractValueFromCpuInfoFile(&sStack_308,pSStack_370,&sStack_120,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
    operator_delete(sStack_120._M_dataplus._M_p,sStack_120.field_2._M_allocated_capacity + 1);
  }
  if (sStack_308._M_string_length == 0) {
    sStack_140._M_dataplus._M_p = (pointer)&sStack_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_140,puStack_3d0,puStack_3d0 + lStack_3c8);
    ExtractValueFromCpuInfoFile(&sStack_348,pSVar5,&sStack_140,"ncpus probed",0);
    std::__cxx11::string::operator=((string *)&sStack_308,(string *)&sStack_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p) !=
        &sStack_348.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p),
                      sStack_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
      operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
    }
  }
  iVar8 = atoi(sStack_308._M_dataplus._M_p);
  iVar7 = (iVar7 + (uint)bVar16) * (iVar8 + (uint)(iVar8 == 0));
  uVar15 = iVar7 + (uint)(iVar7 == 0);
  pSVar5->NumberOfPhysicalCPU = uVar15;
  if (pSVar5->NumberOfLogicalCPU == 0) {
    pSVar5->NumberOfLogicalCPU = uVar15;
  }
  (pSVar5->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar5->NumberOfLogicalCPU / uVar15;
  sStack_160._M_dataplus._M_p = (pointer)&sStack_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_160,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_348,pSVar5,&sStack_160,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
    operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
  }
  if (sStack_348._M_string_length == 0) {
    sStack_180._M_dataplus._M_p = (pointer)&sStack_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_180,puStack_3d0,puStack_3d0 + lStack_3c8);
    ExtractValueFromCpuInfoFile(&sStack_368,pSVar5,&sStack_180,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_348,(string *)&sStack_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_368._M_dataplus._M_p != &sStack_368.field_2) {
      operator_delete(sStack_368._M_dataplus._M_p,sStack_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_180._M_dataplus._M_p != &sStack_180.field_2) {
      operator_delete(sStack_180._M_dataplus._M_p,sStack_180.field_2._M_allocated_capacity + 1);
    }
    if (sStack_348._M_string_length == 0) {
      sStack_1a0._M_dataplus._M_p = (pointer)&sStack_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_1a0,puStack_3d0,puStack_3d0 + lStack_3c8);
      ExtractValueFromCpuInfoFile(&sStack_368,pSVar5,&sStack_1a0,"CPU0ClkTck",0);
      std::__cxx11::string::operator=((string *)&sStack_348,(string *)&sStack_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_368._M_dataplus._M_p != &sStack_368.field_2) {
        operator_delete(sStack_368._M_dataplus._M_p,sStack_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1a0._M_dataplus._M_p != &sStack_1a0.field_2) {
        operator_delete(sStack_1a0._M_dataplus._M_p,sStack_1a0.field_2._M_allocated_capacity + 1);
      }
      __nptr = (char *)CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p);
      iVar7 = 10;
    }
    else {
      __nptr = (char *)CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p);
      iVar7 = 0x10;
    }
    uVar10 = strtoull(__nptr,(char **)0x0,iVar7);
    fVar17 = (float)uVar10 / 1e+06;
  }
  else {
    dVar3 = atof((char *)CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p
                                 ));
    fVar17 = (float)dVar3;
  }
  pSVar5->CPUSpeedInMHz = fVar17;
  sStack_1c0._M_dataplus._M_p = (pointer)&sStack_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1c0,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_368,pSVar5,&sStack_1c0,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
    operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
  }
  if (sStack_368._M_string_length == 0) {
    sStack_1e0._M_dataplus._M_p = (pointer)&sStack_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1e0,puStack_3d0,puStack_3d0 + lStack_3c8);
    ExtractValueFromCpuInfoFile(&sStack_390,pSVar5,&sStack_1e0,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_368,(string *)&sStack_390);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_390._M_dataplus._M_p != &sStack_390.field_2) {
      operator_delete(sStack_390._M_dataplus._M_p,sStack_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
      operator_delete(sStack_1e0._M_dataplus._M_p,sStack_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_368._M_dataplus._M_p);
  (pSVar5->ChipID).Family = iVar7;
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_200,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_390,pSVar5,&sStack_200,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).Vendor,(string *)&sStack_390);
  paVar2 = &sStack_390.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_390._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_390._M_dataplus._M_p,sStack_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
    operator_delete(sStack_200._M_dataplus._M_p,sStack_200.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar5,&sStack_368);
  if (((pSVar5->ChipID).Family == 0) && (pSVar5->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&sStack_368);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&sStack_368);
      if (iVar7 != 0) goto LAB_0059b631;
      iVar7 = 0x200;
    }
    (pSVar5->ChipID).Family = iVar7;
  }
LAB_0059b631:
  sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_220,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_390,pSVar5,&sStack_220,"model",0);
  _Var4._M_p = sStack_390._M_dataplus._M_p;
  iVar7 = atoi(sStack_390._M_dataplus._M_p);
  (pSVar5->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar2) {
    operator_delete(_Var4._M_p,sStack_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
    operator_delete(sStack_220._M_dataplus._M_p,sStack_220.field_2._M_allocated_capacity + 1);
  }
  bVar16 = RetrieveClassicalCPUIdentity(pSVar5);
  if (!bVar16) {
    sStack_240._M_dataplus._M_p = (pointer)&sStack_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_240,puStack_3d0,puStack_3d0 + lStack_3c8);
    ExtractValueFromCpuInfoFile(&sStack_390,pSVar5,&sStack_240,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_240._M_dataplus._M_p != &sStack_240.field_2) {
      operator_delete(sStack_240._M_dataplus._M_p,sStack_240.field_2._M_allocated_capacity + 1);
    }
    if (sStack_390._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar5->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_390._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_390._M_dataplus._M_p,sStack_390.field_2._M_allocated_capacity + 1);
    }
  }
  sStack_260._M_dataplus._M_p = (pointer)&sStack_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_260,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_390,pSVar5,&sStack_260,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_260._M_dataplus._M_p != &sStack_260.field_2) {
    operator_delete(sStack_260._M_dataplus._M_p,sStack_260.field_2._M_allocated_capacity + 1);
  }
  if (sStack_390._M_string_length == 0) {
    sStack_280._M_dataplus._M_p = (pointer)&sStack_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_280,puStack_3d0,puStack_3d0 + lStack_3c8);
    ExtractValueFromCpuInfoFile(&sStack_3b0,pSVar5,&sStack_280,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_390,(string *)&sStack_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_3b0._M_dataplus._M_p != &sStack_3b0.field_2) {
      operator_delete(sStack_3b0._M_dataplus._M_p,sStack_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_280._M_dataplus._M_p != &sStack_280.field_2) {
      operator_delete(sStack_280._M_dataplus._M_p,sStack_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_390._M_dataplus._M_p);
  (pSVar5->ChipID).Revision = iVar7;
  sStack_2a0._M_dataplus._M_p = (pointer)&sStack_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_2a0,puStack_3d0,puStack_3d0 + lStack_3c8);
  ExtractValueFromCpuInfoFile(&sStack_3b0,pSVar5,&sStack_2a0,"model name",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).ModelName,(string *)&sStack_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b0._M_dataplus._M_p != &sStack_3b0.field_2) {
    operator_delete(sStack_3b0._M_dataplus._M_p,sStack_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2a0._M_dataplus._M_p != &sStack_2a0.field_2) {
    operator_delete(sStack_2a0._M_dataplus._M_p,sStack_2a0.field_2._M_allocated_capacity + 1);
  }
  puStack_328 = (undefined8 *)0x0;
  lStack_318 = 0;
  puStack_320 = (undefined8 *)0x0;
  sStack_3b0._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_328,(char **)&sStack_3b0);
  sStack_3b0._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_328,(char **)&sStack_3b0);
  sStack_3b0._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_328,(char **)&sStack_3b0);
  puVar6 = puStack_320;
  (pSVar5->Features).L1CacheSize = 0;
  if (puStack_328 != puStack_320) {
    puVar14 = puStack_328;
    do {
      sStack_2c0._M_dataplus._M_p = (pointer)&sStack_2c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_2c0,puStack_3d0,puStack_3d0 + lStack_3c8);
      ExtractValueFromCpuInfoFile(&sStack_3b0,pSStack_370,&sStack_2c0,(char *)*puVar14,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_2c0._M_dataplus._M_p != &sStack_2c0.field_2) {
        operator_delete(sStack_2c0._M_dataplus._M_p,sStack_2c0.field_2._M_allocated_capacity + 1);
      }
      if (sStack_3b0._M_string_length != 0) {
        lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2716,0);
        if (lVar9 != -1) {
          std::__cxx11::string::resize((ulong)&sStack_3b0,(char)lVar9);
        }
        iVar7 = atoi(sStack_3b0._M_dataplus._M_p);
        piVar1 = &(pSStack_370->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_3b0._M_dataplus._M_p != &sStack_3b0.field_2) {
        operator_delete(sStack_3b0._M_dataplus._M_p,sStack_3b0.field_2._M_allocated_capacity + 1);
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar6);
  }
  sStack_2e0._M_dataplus._M_p = (pointer)&sStack_2e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_2e0,puStack_3d0,puStack_3d0 + lStack_3c8);
  pSVar5 = pSStack_370;
  ExtractValueFromCpuInfoFile(&sStack_3b0,pSStack_370,&sStack_2e0,"flags",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2e0._M_dataplus._M_p != &sStack_2e0.field_2) {
    operator_delete(sStack_2e0._M_dataplus._M_p,sStack_2e0.field_2._M_allocated_capacity + 1);
  }
  if (sStack_390._M_string_length != 0) {
    std::operator+(&bStack_a0," ",&sStack_3b0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&bStack_a0);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      lStack_70 = *plVar12;
      lStack_68 = plVar11[3];
      plStack_80 = &lStack_70;
    }
    else {
      lStack_70 = *plVar12;
      plStack_80 = (long *)*plVar11;
    }
    lStack_78 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&sStack_3b0,(string *)&plStack_80);
    if (plStack_80 != &lStack_70) {
      operator_delete(plStack_80,lStack_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_a0._M_dataplus._M_p != &bStack_a0.field_2) {
      operator_delete(bStack_a0._M_dataplus._M_p,bStack_a0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b271a,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasFPU = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2720,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasTSC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2726,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMMX = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b272c,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2732,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE2 = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2739,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasAPIC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2740,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasCMOV = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2747,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMTRR = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b274e,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasACPI = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3b0,0x7b2755,0);
    if (lVar9 != -1) {
      (pSVar5->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3b0._M_dataplus._M_p != &sStack_3b0.field_2) {
    operator_delete(sStack_3b0._M_dataplus._M_p,sStack_3b0.field_2._M_allocated_capacity + 1);
  }
  if (puStack_328 != (undefined8 *)0x0) {
    operator_delete(puStack_328,lStack_318 - (long)puStack_328);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_390._M_dataplus._M_p != &sStack_390.field_2) {
    operator_delete(sStack_390._M_dataplus._M_p,sStack_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_368._M_dataplus._M_p != &sStack_368.field_2) {
    operator_delete(sStack_368._M_dataplus._M_p,sStack_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p) !=
      &sStack_348.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(sStack_348._M_dataplus._M_p._4_4_,(int)sStack_348._M_dataplus._M_p),
                    sStack_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_308._M_dataplus._M_p != &sStack_308.field_2) {
    operator_delete(sStack_308._M_dataplus._M_p,sStack_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_60);
LAB_0059bdfb:
  if (puStack_3d0 != &uStack_3c0) {
    operator_delete(puStack_3d0,CONCAT71(uStack_3bf,uStack_3c0) + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetrieveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}